

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

ProgramSources * __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicTriangleFillCoverCase::makeSources
          (ProgramSources *__return_storage_ptr__,BasicTriangleFillCoverCase *this,
          TessPrimitiveType primitiveType,SpacingMode spacing,char *vtxOutPosAttrName)

{
  char *pcVar1;
  ProgramSources *pPVar2;
  char *code;
  char *__rhs;
  undefined1 usePointMode;
  string tessellationEvaluationTemplate;
  string fragmentShaderTemplate;
  string vertexShaderTemplate;
  undefined1 local_230 [40];
  undefined1 local_208 [40];
  undefined1 local_1e0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  string local_178;
  string local_158;
  Context *local_138 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ProgramSources local_f8;
  
  usePointMode = SUB81(vtxOutPosAttrName,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_230,vtxOutPosAttrName,(allocator<char> *)&local_1b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 "${GLSL_VERSION_DECL}\n\nin highp vec2 in_v_position;\n\nout highp vec2 ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 ";\n\nvoid main (void)\n{\n\t");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                 vtxOutPosAttrName);
  std::operator+(&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 " = in_v_position;\n}\n");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_230);
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_230,(_anonymous_namespace_ *)(ulong)primitiveType,spacing,
             SPACINGMODE_EQUAL,(bool)usePointMode);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 "\nin highp vec2 in_te_position[];\n\nprecise gl_Position;\nvoid main (void)\n{\n")
  ;
  pcVar1 = (char *)0x0;
  code = 
  "\thighp vec2 corner0 = in_te_position[0];\n\thighp vec2 corner1 = in_te_position[1];\n\thighp vec2 corner2 = in_te_position[2];\n\thighp vec2 corner3 = in_te_position[3];\n\thighp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n\t               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n\t               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n\t               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n\thighp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n\thighp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n\thighp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n\tpos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n\tgl_Position = vec4(pos, 0.0, 1.0);\n"
  ;
  if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pcVar1 = 
    "\thighp vec2 corner0 = in_te_position[0];\n\thighp vec2 corner1 = in_te_position[1];\n\thighp vec2 corner2 = in_te_position[2];\n\thighp vec2 corner3 = in_te_position[3];\n\thighp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n\t               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n\t               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n\t               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n\thighp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n\thighp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n\thighp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n\tpos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n\tgl_Position = vec4(pos, 0.0, 1.0);\n"
    ;
  }
  __rhs = 
  "\n\thighp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n\thighp vec2 corner0 = in_te_position[0];\n\thighp vec2 corner1 = in_te_position[1];\n\thighp vec2 corner2 = in_te_position[2];\n\thighp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n\thighp vec2 fromCenter = pos - (corner0 + corner1 + corner2) / 3.0;\n\thighp float f = (1.0 - length(fromCenter)) * (1.5 - d);\n\tpos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n\tgl_Position = vec4(pos, 0.0, 1.0);\n"
  ;
  if (primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    __rhs = pcVar1;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                 __rhs);
  std::operator+(&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 "}\n");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n\to_color = vec4(1.0);\n}\n"
             ,(allocator<char> *)&local_f8);
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_158,
             (_anonymous_namespace_ *)
             (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context,
             (Context *)local_118._M_dataplus._M_p,code);
  glu::VertexSource::VertexSource((VertexSource *)local_1e0,&local_158);
  pPVar2 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_1e0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_178,
             (_anonymous_namespace_ *)
             (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context,
             (Context *)local_1b8._M_dataplus._M_p,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_208,&local_178);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_208);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_198,
             (_anonymous_namespace_ *)
             (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context,local_138[0],
             code);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_230,&local_198);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_230);
  glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar2);
  std::__cxx11::string::~string((string *)(local_230 + 8));
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)(local_208 + 8));
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)(local_1e0 + 8));
  std::__cxx11::string::~string((string *)&local_158);
  glu::ProgramSources::~ProgramSources(&local_f8);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

const glu::ProgramSources makeSources (TessPrimitiveType primitiveType, SpacingMode spacing, const char* vtxOutPosAttrName) const
	{
		std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "\n"
													 "out highp vec2 " + string(vtxOutPosAttrName) + ";\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	" + vtxOutPosAttrName + " = in_v_position;\n"
													 "}\n");
		std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
													 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "${GPU_SHADER5_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(primitiveType, spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "precise gl_Position;\n"
													 "void main (void)\n"
													 "{\n"
													 + (primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"\n"
														"	highp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n"
														"	highp vec2 corner0 = in_te_position[0];\n"
														"	highp vec2 corner1 = in_te_position[1];\n"
														"	highp vec2 corner2 = in_te_position[2];\n"
														"	highp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n"
														"	highp vec2 fromCenter = pos - (corner0 + corner1 + corner2) / 3.0;\n"
														"	highp float f = (1.0 - length(fromCenter)) * (1.5 - d);\n"
														"	pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n"
														"	gl_Position = vec4(pos, 0.0, 1.0);\n"
													  : primitiveType == TESSPRIMITIVETYPE_QUADS ?
														"	highp vec2 corner0 = in_te_position[0];\n"
														"	highp vec2 corner1 = in_te_position[1];\n"
														"	highp vec2 corner2 = in_te_position[2];\n"
														"	highp vec2 corner3 = in_te_position[3];\n"
														"	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
														"	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
														"	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
														"	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
														"	highp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n"
														"	highp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n"
														"	highp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n"
														"	pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n"
														"	gl_Position = vec4(pos, 0.0, 1.0);\n"
													  : DE_NULL) +
													 "}\n");
		std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0);\n"
													 "}\n");

		return glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()));
	}